

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statements.cpp
# Opt level: O2

void __thiscall hsql::CreateStatement::~CreateStatement(CreateStatement *this)

{
  vector<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_> *pvVar1;
  pointer ppCVar2;
  _Vector_base<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_> *this_00;
  vector<char_*,_std::allocator<char_*>_> *pvVar3;
  pointer ppcVar4;
  _Vector_base<char_*,_std::allocator<char_*>_> *this_01;
  pointer ppCVar5;
  pointer ppcVar6;
  
  (this->super_SQLStatement)._vptr_SQLStatement = (_func_int **)&PTR__CreateStatement_00127920;
  free(this->filePath);
  free(this->tableName);
  if (this->select != (SelectStatement *)0x0) {
    (*(this->select->super_SQLStatement)._vptr_SQLStatement[1])();
  }
  pvVar1 = this->columns;
  if (pvVar1 != (vector<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_> *)0x0)
  {
    ppCVar2 = (pvVar1->
              super__Vector_base<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (ppCVar5 = (pvVar1->
                   super__Vector_base<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppCVar5 != ppCVar2;
        ppCVar5 = ppCVar5 + 1) {
      if (*ppCVar5 != (ColumnDefinition *)0x0) {
        (*(*ppCVar5)->_vptr_ColumnDefinition[1])();
      }
    }
    this_00 = &this->columns->
               super__Vector_base<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_>
    ;
    if (this_00 !=
        (_Vector_base<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_> *)0x0) {
      std::_Vector_base<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_>::
      ~_Vector_base(this_00);
    }
    operator_delete(this_00);
  }
  pvVar3 = this->viewColumns;
  if (pvVar3 != (vector<char_*,_std::allocator<char_*>_> *)0x0) {
    ppcVar4 = (pvVar3->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppcVar6 = (pvVar3->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
                   super__Vector_impl_data._M_start; ppcVar6 != ppcVar4; ppcVar6 = ppcVar6 + 1) {
      free(*ppcVar6);
    }
    this_01 = &this->viewColumns->super__Vector_base<char_*,_std::allocator<char_*>_>;
    if (this_01 != (_Vector_base<char_*,_std::allocator<char_*>_> *)0x0) {
      std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base(this_01);
    }
    operator_delete(this_01);
    return;
  }
  return;
}

Assistant:

CreateStatement::~CreateStatement() {
    free(filePath);
    free(tableName);
    delete select;

    if (columns != NULL) {
      for (ColumnDefinition* def : *columns) {
        delete def;
      }
      delete columns;
    }

    if (viewColumns != NULL) {
      for (char* column : *viewColumns) {
        free(column);
      }
      delete viewColumns;
    }
  }